

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

bool WaitForSession(SSL *ssl,int sock)

{
  bool bVar1;
  uint __i;
  int iVar2;
  int ssl_err;
  long lVar3;
  fd_set *__arr;
  fd_set read_fds;
  uint8_t buffer [512];
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    read_fds.fds_bits[lVar3] = 0;
  }
  bVar1 = SocketSetNonBlocking(sock,true);
  if (bVar1) {
    do {
      if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
          resume_session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
        return true;
      }
      read_fds.fds_bits[sock / 0x40] = read_fds.fds_bits[sock / 0x40] | 1L << ((byte)sock & 0x3f);
      iVar2 = select(sock + 1,(fd_set *)&read_fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (iVar2 < 1) {
        perror("select");
        return false;
      }
      iVar2 = SSL_read((SSL *)ssl,buffer,0x200);
    } while ((0 < iVar2) || (ssl_err = SSL_get_error((SSL *)ssl,iVar2), ssl_err == 2));
    PrintSSLError(_stderr,"Error while reading",ssl_err,iVar2);
  }
  return false;
}

Assistant:

static bool WaitForSession(SSL *ssl, int sock) {
  fd_set read_fds;
  FD_ZERO(&read_fds);

  if (!SocketSetNonBlocking(sock, true)) {
    return false;
  }

  while (!resume_session) {
#if defined(OPENSSL_WINDOWS)
    // Windows sockets are really of type SOCKET, not int, but everything here
    // casts them to ints. Clang gets unhappy about signed values as a result.
    //
    // TODO(davidben): Keep everything as the appropriate platform type.
    FD_SET(static_cast<SOCKET>(sock), &read_fds);
#else
    FD_SET(sock, &read_fds);
#endif
    int ret = select(sock + 1, &read_fds, NULL, NULL, NULL);
    if (ret <= 0) {
      perror("select");
      return false;
    }

    uint8_t buffer[512];
    int ssl_ret = SSL_read(ssl, buffer, sizeof(buffer));

    if (ssl_ret <= 0) {
      int ssl_err = SSL_get_error(ssl, ssl_ret);
      if (ssl_err == SSL_ERROR_WANT_READ) {
        continue;
      }
      PrintSSLError(stderr, "Error while reading", ssl_err, ssl_ret);
      return false;
    }
  }

  return true;
}